

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Constraint * __thiscall am_CList::Remove_Con(am_CList *this,CItem *item)

{
  Am_Constraint *pAVar1;
  CItem *pCVar2;
  CItem *pCVar3;
  CItem *pCVar4;
  
  if (this->head != (CItem *)0x0) {
    pCVar2 = (CItem *)0x0;
    pCVar3 = this->head;
    do {
      if (pCVar3 == item) {
        pCVar4 = pCVar3->next;
        if (pCVar2 == (CItem *)0x0) {
          this->head = pCVar4;
        }
        else {
          pCVar2->next = pCVar4;
        }
      }
      else {
        pCVar4 = pCVar3->next;
      }
      pCVar2 = pCVar3;
      pCVar3 = pCVar4;
    } while (pCVar4 != (CItem *)0x0);
  }
  pAVar1 = item->value;
  item->value = (Am_Constraint *)0x0;
  (item->field_1).prev = (CItem *)0x0;
  item->next = (CItem *)0x0;
  Dyn_Memory_Manager::Delete(&CItem::memory,item);
  return pAVar1;
}

Assistant:

Am_Constraint *
am_CList::Remove_Con(CItem *item)
{
  CItem *prev = nullptr;
  CItem *curr = head;
  while (curr) {
    if (item == curr) {
      if (prev)
        prev->next = curr->next;
      else
        head = curr->next;
    }
    prev = curr;
    curr = curr->next;
  }
  Am_Constraint *value = item->value;
  item->prev = nullptr;
  item->next = nullptr;
  item->value = nullptr;
  delete item;
  return value;
}